

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

int lj_tab_next(GCtab *t,cTValue *key,TValue *o)

{
  TValue *pTVar1;
  uint64_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  TValue TVar6;
  
  uVar3 = lj_tab_keyindex(t,key);
  uVar4 = t->asize;
  if (uVar3 < uVar4) {
    uVar2 = (t->array).ptr64;
    uVar5 = (ulong)uVar3;
    do {
      if (*(long *)(uVar2 + uVar5 * 8) != -1) {
        o->n = (double)(int)uVar5;
        TVar6 = *(TValue *)(uVar2 + uVar5 * 8);
        goto LAB_00129565;
      }
      uVar5 = uVar5 + 1;
      uVar3 = uVar4;
    } while (uVar4 != uVar5);
  }
  uVar4 = uVar3 - uVar4;
  if (uVar4 <= t->hmask) {
    uVar2 = (t->node).ptr64;
    do {
      if (*(long *)(uVar2 + (ulong)uVar4 * 0x18) != -1) {
        pTVar1 = (TValue *)(uVar2 + (ulong)uVar4 * 0x18);
        *o = pTVar1[1];
        TVar6 = *pTVar1;
LAB_00129565:
        o[1] = TVar6;
        return 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 <= t->hmask);
  }
  return (int)uVar4 >> 0x1f;
}

Assistant:

int lj_tab_next(GCtab *t, cTValue *key, TValue *o)
{
  uint32_t idx = lj_tab_keyindex(t, key);  /* Find successor index of key. */
  /* First traverse the array part. */
  for (; idx < t->asize; idx++) {
    cTValue *a = arrayslot(t, idx);
    if (LJ_LIKELY(!tvisnil(a))) {
      setintV(o, idx);
      o[1] = *a;
      return 1;
    }
  }
  idx -= t->asize;
  /* Then traverse the hash part. */
  for (; idx <= t->hmask; idx++) {
    Node *n = &noderef(t->node)[idx];
    if (!tvisnil(&n->val)) {
      o[0] = n->key;
      o[1] = n->val;
      return 1;
    }
  }
  return (int32_t)idx < 0 ? -1 : 0;  /* Invalid key or end of traversal. */
}